

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalWrenchesEstimation.cpp
# Opt level: O0

Wrench * iDynTree::getMeasuredWrench
                   (SensorsList *sensor_list,SensorsMeasurements *sensor_measures,LinkIndex link_id)

{
  Wrench *this;
  Wrench *in_RCX;
  SensorType *in_RDX;
  SensorType *in_RSI;
  Wrench *in_RDI;
  bool ok;
  Wrench measured_wrench_by_sensor;
  Wrench measured_wrench_on_link;
  SixAxisForceTorqueSensor *sens;
  size_t ft;
  size_t NrOfFTSensors;
  Wrench *total_measured_applied_wrench;
  Wrench local_180;
  undefined1 local_148 [72];
  SpatialForceVector local_100 [56];
  Wrench local_c8;
  undefined4 local_8c;
  Wrench *local_88;
  ulong local_80;
  SpatialForceVector local_68 [59];
  undefined1 local_2d;
  undefined4 local_2c;
  ulong local_28;
  Wrench *local_20;
  SensorType *local_18;
  SensorType *local_10;
  
  local_2c = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_28 = iDynTree::SensorsList::getNrOfSensors(in_RSI);
  local_2d = 0;
  SpatialVector<iDynTree::SpatialForceVector>::Zero();
  iDynTree::Wrench::Wrench(in_RDI,local_68);
  iDynTree::SpatialForceVector::~SpatialForceVector(local_68);
  for (local_80 = 0; local_80 < local_28; local_80 = local_80 + 1) {
    local_8c = 0;
    this = (Wrench *)iDynTree::SensorsList::getSensor(local_10,(long)&local_8c);
    local_88 = this;
    SpatialVector<iDynTree::SpatialForceVector>::Zero();
    iDynTree::Wrench::Wrench(&local_c8,local_100);
    iDynTree::SpatialForceVector::~SpatialForceVector(local_100);
    Wrench::Wrench(this);
    local_148._8_4_ = 0;
    local_148._0_8_ = local_80;
    local_148[0xf] =
         iDynTree::SensorsMeasurements::getMeasurement
                   (local_18,(long *)(local_148 + 8),(Wrench *)local_148);
    local_148[0xf] = local_148[0xf] & 1;
    iDynTree::SixAxisForceTorqueSensor::getWrenchAppliedOnLink
              ((long)local_88,local_20,(Wrench *)(local_148 + 0x10));
    iDynTree::Wrench::operator+(&local_180,in_RDI);
    iDynTree::Wrench::operator=(in_RDI,&local_180);
    Wrench::~Wrench((Wrench *)0x5451ea);
    Wrench::~Wrench((Wrench *)0x5451f4);
    Wrench::~Wrench((Wrench *)0x545201);
  }
  return in_RDI;
}

Assistant:

Wrench getMeasuredWrench(const SensorsList & sensor_list,
                         const SensorsMeasurements & sensor_measures,
                         const LinkIndex link_id)
{
    size_t NrOfFTSensors = sensor_list.getNrOfSensors(SIX_AXIS_FORCE_TORQUE);
    ::iDynTree::Wrench total_measured_applied_wrench = ::iDynTree::Wrench::Zero();
    for(size_t ft=0; ft < NrOfFTSensors; ft++ )
    {
        ::iDynTree::SixAxisForceTorqueSensor * sens
            = (::iDynTree::SixAxisForceTorqueSensor *) sensor_list.getSensor(::iDynTree::SIX_AXIS_FORCE_TORQUE,ft);

        assert(sens != 0);

        Wrench measured_wrench_on_link = Wrench::Zero();
        Wrench measured_wrench_by_sensor;

        bool ok = sensor_measures.getMeasurement(SIX_AXIS_FORCE_TORQUE,ft,measured_wrench_by_sensor);

        IDYNTREE_UNUSED(ok);
        assert(ok);

        // If the sensor with index ft is not attached to the link
        // this function return a zero wrench
        sens->getWrenchAppliedOnLink(link_id,measured_wrench_by_sensor,measured_wrench_on_link);

        //Sum the given wrench to the return value
        total_measured_applied_wrench = total_measured_applied_wrench+measured_wrench_on_link;
    }

    return total_measured_applied_wrench;
}